

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O1

void av1_iadst16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int32_t *piVar3;
  int8_t *piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  undefined7 in_register_00000011;
  long lVar8;
  long lVar9;
  long lVar10;
  int32_t iVar11;
  long lVar12;
  int32_t step [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  uint local_a0;
  uint local_9c;
  long local_90;
  long local_88;
  int32_t *local_80;
  int8_t *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int local_58;
  undefined4 uStack_54;
  ulong local_50;
  int local_48;
  undefined4 uStack_44;
  int local_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  lVar8 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = input[0xf];
  output[1] = *input;
  output[2] = input[0xd];
  output[3] = input[2];
  output[4] = input[0xb];
  output[5] = input[4];
  output[6] = input[9];
  output[7] = input[6];
  output[8] = input[7];
  output[9] = input[8];
  output[10] = input[5];
  output[0xb] = input[10];
  output[0xc] = input[3];
  output[0xd] = input[0xc];
  output[0xe] = input[1];
  output[0xf] = input[0xe];
  local_78 = stage_range;
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  piVar4 = local_78;
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 600);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x168);
  local_88 = 1L << (cos_bit - 1U & 0x3f);
  local_d8._0_4_ =
       (int)(*output * iVar7 + local_88 + (long)(output[1] * iVar5) >> (cos_bit & 0x3fU));
  local_d8._4_4_ =
       (int)(iVar5 * *output + local_88 + (long)-(iVar7 * output[1]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x188);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x238);
  uStack_d0._0_4_ =
       (int)(output[2] * iVar5 + local_88 + (long)(output[3] * iVar7) >> (cos_bit & 0x3fU));
  uStack_d0._4_4_ =
       (int)(iVar7 * output[2] + local_88 + (long)-(iVar5 * output[3]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1a8);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x218);
  local_c8._0_4_ =
       (int)(output[4] * iVar5 + local_88 + (long)(output[5] * iVar7) >> (cos_bit & 0x3fU));
  local_c8._4_4_ =
       (int)(iVar7 * output[4] + local_88 + (long)-(iVar5 * output[5]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1c8);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1f8);
  uStack_c0._0_4_ =
       (int)(output[6] * iVar5 + local_88 + (long)(output[7] * iVar7) >> (cos_bit & 0x3fU));
  uStack_c0._4_4_ =
       (int)(iVar7 * output[6] + local_88 + (long)-(iVar5 * output[7]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1e8);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1d8);
  local_b8._0_4_ =
       (int)(output[8] * iVar5 + local_88 + (long)(output[9] * iVar7) >> (cos_bit & 0x3fU));
  local_b8._4_4_ =
       (uint)(iVar7 * output[8] + local_88 + (long)-(iVar5 * output[9]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x208);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x1b8);
  uStack_b0._0_4_ =
       (int)(output[10] * iVar5 + local_88 + (long)(output[0xb] * iVar7) >> (cos_bit & 0x3fU));
  uStack_b0._4_4_ =
       (uint)(iVar7 * output[10] + local_88 + (long)-(iVar5 * output[0xb]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x228);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x198);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x178);
  local_a8._0_4_ =
       (int)(output[0xc] * iVar5 + local_88 + (long)(output[0xd] * iVar7) >> (cos_bit & 0x3fU));
  local_a8._4_4_ =
       (uint)(iVar7 * output[0xc] + local_88 + (long)-(iVar5 * output[0xd]) >> (cos_bit & 0x3fU));
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar8 + 0x248);
  local_a0 = (uint)(output[0xe] * iVar5 + local_88 + (long)(output[0xf] * iVar1) >>
                   (cos_bit & 0x3fU));
  local_9c = (uint)(iVar1 * output[0xe] + local_88 + (long)-(iVar5 * output[0xf]) >>
                   (cos_bit & 0x3fU));
  local_90 = lVar8;
  local_80 = input;
  av1_range_check_buf(2,input,(int32_t *)&local_d8,0x10,local_78[2]);
  piVar3 = local_80;
  lVar8 = local_90;
  local_40 = (int)local_b8;
  uStack_3c = 0;
  iVar5 = (int)local_b8 + (int)local_d8;
  if ('\0' < piVar4[3]) {
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = (long)iVar5;
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  *output = iVar5;
  local_38 = (ulong)local_b8._4_4_;
  iVar5 = local_b8._4_4_ + local_d8._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[1] = iVar5;
  local_48 = (int)uStack_b0;
  uStack_44 = 0;
  iVar11 = (int)uStack_b0 + (int)uStack_d0;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar11;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar11 = (int32_t)lVar12;
  }
  output[2] = iVar11;
  local_50 = (ulong)uStack_b0._4_4_;
  iVar11 = uStack_b0._4_4_ + uStack_d0._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar11;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar11 = (int32_t)lVar12;
  }
  output[3] = iVar11;
  local_58 = (int)local_a8;
  uStack_54 = 0;
  iVar11 = (int)local_a8 + (int)local_c8;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar11;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar11 = (int32_t)lVar12;
  }
  output[4] = iVar11;
  local_60 = (ulong)local_a8._4_4_;
  iVar11 = local_a8._4_4_ + local_c8._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar11;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar11 = (int32_t)lVar12;
  }
  output[5] = iVar11;
  local_68 = (ulong)local_a0;
  iVar11 = local_a0 + (int)uStack_c0;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar11;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar11 = (int32_t)lVar12;
  }
  output[6] = iVar11;
  local_70 = (ulong)local_9c;
  iVar5 = local_9c + uStack_c0._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[7] = iVar5;
  iVar5 = (int)local_d8 - (int)local_b8;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[8] = iVar5;
  iVar5 = local_d8._4_4_ - local_b8._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[9] = iVar5;
  iVar5 = (int)uStack_d0 - (int)uStack_b0;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)((int)uStack_d0 - (int)uStack_b0);
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[10] = iVar5;
  iVar5 = uStack_d0._4_4_ - uStack_b0._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)(int)(uStack_d0._4_4_ - uStack_b0._4_4_);
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  output[0xb] = iVar5;
  iVar5 = (int)local_c8 - (int)local_a8;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)((int)local_c8 - (int)local_a8);
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  output[0xc] = iVar5;
  iVar5 = local_c8._4_4_ - local_a8._4_4_;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)(int)(local_c8._4_4_ - local_a8._4_4_);
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  output[0xd] = iVar5;
  iVar5 = (int)uStack_c0 - local_a0;
  if ('\0' < piVar4[3]) {
    lVar6 = (long)(int)((int)uStack_c0 - local_a0);
    lVar9 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  lVar10 = local_90 + 0x51af70;
  output[0xe] = iVar5;
  iVar5 = uStack_c0._4_4_ - local_9c;
  if ('\0' < piVar4[3]) {
    lVar9 = (long)(int)(uStack_c0._4_4_ - local_9c);
    lVar12 = 1L << (piVar4[3] - 1U & 0x3f);
    lVar6 = lVar12 + -1;
    if (lVar9 < lVar12 + -1) {
      lVar6 = lVar9;
    }
    iVar5 = (int32_t)-lVar12;
    if (SBORROW8(lVar9,-lVar12) == lVar9 + lVar12 < 0) {
      iVar5 = (int32_t)lVar6;
    }
  }
  output[0xf] = iVar5;
  av1_range_check_buf(3,local_80,output,0x10,piVar4[3]);
  local_d8 = *(undefined8 *)output;
  uStack_d0 = *(undefined8 *)(output + 2);
  local_c8 = *(undefined8 *)(output + 4);
  uStack_c0 = *(undefined8 *)(output + 6);
  iVar5 = *(int *)((long)vert_filter_length_chroma[7] + lVar8 + 0x2c);
  iVar7 = *(int *)((long)vert_filter_length_chroma[5] + lVar8 + 4);
  iVar1 = *(int *)((long)vert_filter_length_chroma[5] + lVar8 + 0x44);
  local_b8._0_4_ =
       (int)(output[8] * iVar7 + local_88 + (long)(output[9] * iVar5) >> (cos_bit & 0x3fU));
  local_b8._4_4_ =
       (uint)(iVar5 * output[8] + local_88 + (long)-(iVar7 * output[9]) >> (cos_bit & 0x3fU));
  iVar2 = *(int *)((long)vert_filter_length_chroma[6] + lVar8 + 0x38);
  uStack_b0._0_4_ =
       (int)(output[10] * iVar2 + local_88 + (long)(output[0xb] * iVar1) >> (cos_bit & 0x3fU));
  uStack_b0._4_4_ =
       (uint)(iVar1 * output[10] + local_88 + (long)-(iVar2 * output[0xb]) >> (cos_bit & 0x3fU));
  local_a8._0_4_ =
       (int)(output[0xd] * iVar7 + local_88 + (long)-(iVar5 * output[0xc]) >> (cos_bit & 0x3fU));
  local_a8._4_4_ =
       (uint)(output[0xc] * iVar7 + local_88 + (long)(output[0xd] * iVar5) >> (cos_bit & 0x3fU));
  local_a0 = (uint)(output[0xf] * iVar2 + local_88 + (long)-(iVar1 * output[0xe]) >>
                   (cos_bit & 0x3fU));
  local_9c = (uint)(output[0xe] * iVar2 + local_88 + (long)(output[0xf] * iVar1) >>
                   (cos_bit & 0x3fU));
  local_90 = lVar10;
  av1_range_check_buf(4,piVar3,(int32_t *)&local_d8,0x10,piVar4[4]);
  piVar3 = local_80;
  lVar8 = local_90;
  iVar5 = (int)local_c8 + (int)local_d8;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  *output = iVar5;
  iVar5 = local_c8._4_4_ + local_d8._4_4_;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[1] = iVar5;
  iVar5 = (int)uStack_c0 + (int)uStack_d0;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[2] = iVar5;
  iVar5 = uStack_c0._4_4_ + uStack_d0._4_4_;
  if ('\0' < piVar4[5]) {
    lVar9 = (long)iVar5;
    lVar6 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar6 + -1;
    if (lVar9 < lVar6 + -1) {
      lVar10 = lVar9;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar9,-lVar6) == lVar9 + lVar6 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[3] = iVar5;
  iVar5 = (int)local_d8 - (int)local_c8;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[4] = iVar5;
  iVar5 = local_d8._4_4_ - local_c8._4_4_;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)(local_d8._4_4_ - local_c8._4_4_);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[5] = iVar5;
  iVar5 = (int)uStack_d0 - (int)uStack_c0;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)((int)uStack_d0 - (int)uStack_c0);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[6] = iVar5;
  iVar5 = uStack_d0._4_4_ - uStack_c0._4_4_;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)(uStack_d0._4_4_ - uStack_c0._4_4_);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  output[7] = iVar5;
  iVar5 = (int)local_a8 + (int)local_b8;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[8] = iVar5;
  iVar5 = local_a8._4_4_ + local_b8._4_4_;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[9] = iVar5;
  iVar5 = local_a0 + (int)uStack_b0;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[10] = iVar5;
  iVar5 = local_9c + uStack_b0._4_4_;
  if ('\0' < piVar4[5]) {
    lVar9 = (long)iVar5;
    lVar6 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar6 + -1;
    if (lVar9 < lVar6 + -1) {
      lVar10 = lVar9;
    }
    lVar12 = -lVar6;
    if (SBORROW8(lVar9,-lVar6) == lVar9 + lVar6 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[0xb] = iVar5;
  iVar5 = (int)local_b8 - (int)local_a8;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[0xc] = iVar5;
  iVar5 = local_b8._4_4_ - local_a8._4_4_;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)(int)(local_b8._4_4_ - local_a8._4_4_);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[0xd] = iVar5;
  iVar5 = (int)uStack_b0 - local_a0;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)(int)((int)uStack_b0 - local_a0);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[0xe] = iVar5;
  iVar5 = uStack_b0._4_4_ - local_9c;
  if ('\0' < piVar4[5]) {
    lVar6 = (long)(int)(uStack_b0._4_4_ - local_9c);
    lVar9 = 1L << (piVar4[5] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int32_t)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int32_t)lVar10;
    }
  }
  output[0xf] = iVar5;
  av1_range_check_buf(5,local_80,output,0x10,piVar4[5]);
  local_d8 = *(undefined8 *)output;
  uStack_d0 = *(undefined8 *)(output + 2);
  iVar5 = *(int *)(lVar8 + 0x40);
  iVar7 = *(int *)(lVar8 + 0xc0);
  local_c8._0_4_ =
       (int)(output[4] * iVar5 + local_88 + (long)(output[5] * iVar7) >> (cos_bit & 0x3fU));
  local_c8._4_4_ =
       (int)(output[4] * iVar7 + local_88 + (long)(output[5] * -iVar5) >> (cos_bit & 0x3fU));
  uStack_c0._0_4_ =
       (int)(output[7] * iVar5 + local_88 + (long)(output[6] * -iVar7) >> (cos_bit & 0x3fU));
  uStack_c0._4_4_ =
       (int)(output[6] * iVar5 + local_88 + (long)(output[7] * iVar7) >> (cos_bit & 0x3fU));
  local_b8 = *(undefined8 *)(output + 8);
  uStack_b0 = *(undefined8 *)(output + 10);
  local_a8._0_4_ =
       (int)(output[0xc] * iVar5 + local_88 + (long)(output[0xd] * iVar7) >> (cos_bit & 0x3fU));
  local_a8._4_4_ =
       (uint)(output[0xc] * iVar7 + local_88 + (long)(-iVar5 * output[0xd]) >> (cos_bit & 0x3fU));
  local_a0 = (uint)(output[0xf] * iVar5 + local_88 + (long)(-iVar7 * output[0xe]) >>
                   (cos_bit & 0x3fU));
  local_9c = (uint)(output[0xe] * iVar5 + local_88 + (long)(output[0xf] * iVar7) >>
                   (cos_bit & 0x3fU));
  av1_range_check_buf(6,piVar3,(int32_t *)&local_d8,0x10,piVar4[6]);
  piVar3 = local_80;
  iVar5 = (int)uStack_d0 + (int)local_d8;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  *output = iVar5;
  iVar5 = uStack_d0._4_4_ + local_d8._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[1] = iVar5;
  iVar5 = (int)local_d8 - (int)uStack_d0;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[2] = iVar5;
  iVar5 = local_d8._4_4_ - uStack_d0._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)(local_d8._4_4_ - uStack_d0._4_4_);
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[3] = iVar5;
  iVar5 = (int)uStack_c0 + (int)local_c8;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[4] = iVar5;
  iVar5 = uStack_c0._4_4_ + local_c8._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[5] = iVar5;
  iVar5 = (int)local_c8 - (int)uStack_c0;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[6] = iVar5;
  iVar5 = local_c8._4_4_ - uStack_c0._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)(local_c8._4_4_ - uStack_c0._4_4_);
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[7] = iVar5;
  iVar5 = (int)uStack_b0 + (int)local_b8;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[8] = iVar5;
  iVar5 = uStack_b0._4_4_ + local_b8._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[9] = iVar5;
  iVar5 = (int)local_b8 - (int)uStack_b0;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[10] = iVar5;
  iVar5 = local_b8._4_4_ - uStack_b0._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)(int)(local_b8._4_4_ - uStack_b0._4_4_);
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[0xb] = iVar5;
  iVar5 = local_a0 + (int)local_a8;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[0xc] = iVar5;
  iVar5 = local_9c + local_a8._4_4_;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[0xd] = iVar5;
  iVar5 = (int)local_a8 - local_a0;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)iVar5;
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    lVar12 = -lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      lVar12 = lVar10;
    }
    iVar5 = (int)lVar12;
  }
  output[0xe] = iVar5;
  iVar5 = local_a8._4_4_ - local_9c;
  if ('\0' < piVar4[7]) {
    lVar6 = (long)(int)(local_a8._4_4_ - local_9c);
    lVar9 = 1L << (piVar4[7] - 1U & 0x3f);
    lVar10 = lVar9 + -1;
    if (lVar6 < lVar9 + -1) {
      lVar10 = lVar6;
    }
    iVar5 = (int)-lVar9;
    if (SBORROW8(lVar6,-lVar9) == lVar6 + lVar9 < 0) {
      iVar5 = (int)lVar10;
    }
  }
  output[0xf] = iVar5;
  av1_range_check_buf(7,local_80,output,0x10,piVar4[7]);
  local_d8 = *(undefined8 *)output;
  iVar5 = *(int *)(lVar8 + 0x80);
  lVar8 = (long)iVar5;
  lVar10 = output[2] * lVar8 + local_88;
  iVar7 = -iVar5;
  uStack_d0._0_4_ = (int)(output[3] * iVar5 + lVar10 >> (cos_bit & 0x3fU));
  uStack_d0._4_4_ = (int)(output[3] * iVar7 + lVar10 >> (cos_bit & 0x3fU));
  local_c8 = *(undefined8 *)(output + 4);
  lVar10 = output[6] * lVar8 + local_88;
  uStack_c0._0_4_ = (int)(output[7] * iVar5 + lVar10 >> (cos_bit & 0x3fU));
  uStack_c0._4_4_ = (int)(output[7] * iVar7 + lVar10 >> (cos_bit & 0x3fU));
  local_b8 = *(undefined8 *)(output + 8);
  lVar10 = output[10] * lVar8 + local_88;
  uStack_b0._0_4_ = (int)(output[0xb] * iVar5 + lVar10 >> (cos_bit & 0x3fU));
  uStack_b0._4_4_ = (uint)(output[0xb] * iVar7 + lVar10 >> (cos_bit & 0x3fU));
  local_a8 = *(undefined8 *)(output + 0xc);
  lVar8 = output[0xe] * lVar8 + local_88;
  local_a0 = (uint)(output[0xf] * iVar5 + lVar8 >> (cos_bit & 0x3fU));
  local_9c = (uint)(iVar7 * output[0xf] + lVar8 >> (cos_bit & 0x3fU));
  av1_range_check_buf(8,piVar3,(int32_t *)&local_d8,0x10,piVar4[8]);
  *output = (int)local_d8;
  output[1] = -(int)local_b8;
  output[2] = (int)local_a8;
  output[3] = -(int)local_c8;
  output[4] = (int)uStack_c0;
  output[5] = -local_a0;
  output[6] = (int)uStack_b0;
  output[7] = -(int)uStack_d0;
  output[8] = uStack_d0._4_4_;
  output[9] = -uStack_b0._4_4_;
  output[10] = local_9c;
  output[0xb] = -uStack_c0._4_4_;
  output[0xc] = local_c8._4_4_;
  output[0xd] = -local_a8._4_4_;
  output[0xe] = local_b8._4_4_;
  output[0xf] = -local_d8._4_4_;
  return;
}

Assistant:

void av1_iadst16(const int32_t *input, int32_t *output, int8_t cos_bit,
                 const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 16;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[15];
  bf1[1] = input[0];
  bf1[2] = input[13];
  bf1[3] = input[2];
  bf1[4] = input[11];
  bf1[5] = input[4];
  bf1[6] = input[9];
  bf1[7] = input[6];
  bf1[8] = input[7];
  bf1[9] = input[8];
  bf1[10] = input[5];
  bf1[11] = input[10];
  bf1[12] = input[3];
  bf1[13] = input[12];
  bf1[14] = input[1];
  bf1[15] = input[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[2], bf0[0], cospi[62], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[62], bf0[0], -cospi[2], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[10], bf0[2], cospi[54], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[54], bf0[2], -cospi[10], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[18], bf0[4], cospi[46], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[46], bf0[4], -cospi[18], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[26], bf0[6], cospi[38], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[38], bf0[6], -cospi[26], bf0[7], cos_bit);
  bf1[8] = half_btf(cospi[34], bf0[8], cospi[30], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[30], bf0[8], -cospi[34], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[42], bf0[10], cospi[22], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[22], bf0[10], -cospi[42], bf0[11], cos_bit);
  bf1[12] = half_btf(cospi[50], bf0[12], cospi[14], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[14], bf0[12], -cospi[50], bf0[13], cos_bit);
  bf1[14] = half_btf(cospi[58], bf0[14], cospi[6], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[6], bf0[14], -cospi[58], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[8], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[9], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[10], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[11], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[12], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[13], stage_range[stage]);
  bf1[6] = clamp_value(bf0[6] + bf0[14], stage_range[stage]);
  bf1[7] = clamp_value(bf0[7] + bf0[15], stage_range[stage]);
  bf1[8] = clamp_value(bf0[0] - bf0[8], stage_range[stage]);
  bf1[9] = clamp_value(bf0[1] - bf0[9], stage_range[stage]);
  bf1[10] = clamp_value(bf0[2] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[3] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[4] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[5] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[6] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[7] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[8], bf0[8], cospi[56], bf0[9], cos_bit);
  bf1[9] = half_btf(cospi[56], bf0[8], -cospi[8], bf0[9], cos_bit);
  bf1[10] = half_btf(cospi[40], bf0[10], cospi[24], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[24], bf0[10], -cospi[40], bf0[11], cos_bit);
  bf1[12] = half_btf(-cospi[56], bf0[12], cospi[8], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[8], bf0[12], cospi[56], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[24], bf0[14], cospi[40], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[40], bf0[14], cospi[24], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[12], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[13], stage_range[stage]);
  bf1[10] = clamp_value(bf0[10] + bf0[14], stage_range[stage]);
  bf1[11] = clamp_value(bf0[11] + bf0[15], stage_range[stage]);
  bf1[12] = clamp_value(bf0[8] - bf0[12], stage_range[stage]);
  bf1[13] = clamp_value(bf0[9] - bf0[13], stage_range[stage]);
  bf1[14] = clamp_value(bf0[10] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[11] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = bf0[10];
  bf1[11] = bf0[11];
  bf1[12] = half_btf(cospi[16], bf0[12], cospi[48], bf0[13], cos_bit);
  bf1[13] = half_btf(cospi[48], bf0[12], -cospi[16], bf0[13], cos_bit);
  bf1[14] = half_btf(-cospi[48], bf0[14], cospi[16], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[16], bf0[14], cospi[48], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  bf1[8] = clamp_value(bf0[8] + bf0[10], stage_range[stage]);
  bf1[9] = clamp_value(bf0[9] + bf0[11], stage_range[stage]);
  bf1[10] = clamp_value(bf0[8] - bf0[10], stage_range[stage]);
  bf1[11] = clamp_value(bf0[9] - bf0[11], stage_range[stage]);
  bf1[12] = clamp_value(bf0[12] + bf0[14], stage_range[stage]);
  bf1[13] = clamp_value(bf0[13] + bf0[15], stage_range[stage]);
  bf1[14] = clamp_value(bf0[12] - bf0[14], stage_range[stage]);
  bf1[15] = clamp_value(bf0[13] - bf0[15], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 8
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(cospi[32], bf0[10], cospi[32], bf0[11], cos_bit);
  bf1[11] = half_btf(cospi[32], bf0[10], -cospi[32], bf0[11], cos_bit);
  bf1[12] = bf0[12];
  bf1[13] = bf0[13];
  bf1[14] = half_btf(cospi[32], bf0[14], cospi[32], bf0[15], cos_bit);
  bf1[15] = half_btf(cospi[32], bf0[14], -cospi[32], bf0[15], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 9
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[8];
  bf1[2] = bf0[12];
  bf1[3] = -bf0[4];
  bf1[4] = bf0[6];
  bf1[5] = -bf0[14];
  bf1[6] = bf0[10];
  bf1[7] = -bf0[2];
  bf1[8] = bf0[3];
  bf1[9] = -bf0[11];
  bf1[10] = bf0[15];
  bf1[11] = -bf0[7];
  bf1[12] = bf0[5];
  bf1[13] = -bf0[13];
  bf1[14] = bf0[9];
  bf1[15] = -bf0[1];
}